

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztrnsform.cpp
# Opt level: O0

void __thiscall
TPZTransform<Fad<double>_>::TPZTransform(TPZTransform<Fad<double>_> *this,void **vtt,int dim)

{
  double *x;
  int in_EDX;
  Fad<double> *in_RSI;
  TPZSavable *in_RDI;
  int d;
  Fad<double> *in_stack_ffffffffffffff40;
  TPZFMatrix<Fad<double>_> *this_00;
  double *in_stack_ffffffffffffff48;
  TPZFMatrix<Fad<double>_> *this_01;
  int local_7c;
  Fad<double> *in_stack_ffffffffffffffb8;
  int64_t col;
  int64_t in_stack_ffffffffffffffc8;
  TPZFNMatrix<9,_Fad<double>_> *in_stack_ffffffffffffffd0;
  
  TPZSavable::TPZSavable(in_RDI,(void **)&in_RSI->dx_);
  in_RDI->_vptr_TPZSavable = (_func_int **)in_RSI->val_;
  this_01 = (TPZFMatrix<Fad<double>_> *)(in_RDI + 2);
  col = 0;
  Fad<double>::Fad<double,_nullptr>(in_RSI,in_stack_ffffffffffffff48);
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,col,in_stack_ffffffffffffffb8);
  Fad<double>::~Fad(in_stack_ffffffffffffff40);
  this_00 = (TPZFMatrix<Fad<double>_> *)(in_RDI + 0x3c);
  x = (double *)(long)in_EDX;
  Fad<double>::Fad<double,_nullptr>(in_RSI,x);
  TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix
            ((TPZFNMatrix<3,_Fad<double>_> *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,col
             ,in_stack_ffffffffffffffb8);
  Fad<double>::~Fad((Fad<double> *)this_00);
  *(int *)&in_RDI[1]._vptr_TPZSavable = in_EDX;
  *(int *)((long)&in_RDI[1]._vptr_TPZSavable + 4) = in_EDX;
  TPZFMatrix<Fad<double>_>::Zero(this_00);
  TPZFMatrix<Fad<double>_>::Zero(this_00);
  for (local_7c = 0; local_7c < in_EDX; local_7c = local_7c + 1) {
    TPZFMatrix<Fad<double>_>::operator()(this_01,(int64_t)in_RDI,(int64_t)in_RSI);
    Fad<double>::operator=<double,_nullptr>(in_RSI,x);
  }
  return;
}

Assistant:

TPZTransform<T>::TPZTransform(int dim) :
fMult(dim,dim,0.), fSum(dim,1,0.) {
	fRow = dim;
	fCol = dim;
	fMult.Zero();
	fSum.Zero();
	int d;
	
	for(d=0; d<dim; d++) {
		fMult(d,d) = 1.;
	}
	
}